

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Tags::Parse(Tags *this)

{
  IMkvReader *pReader;
  longlong lVar1;
  longlong lVar2;
  long lVar3;
  long stop;
  longlong pos;
  longlong size;
  longlong id;
  
  pReader = this->m_pSegment->m_pReader;
  pos = this->m_start;
  stop = this->m_size + pos;
  while( true ) {
    if (stop <= pos) {
      return (ulong)(pos == stop) * 2 + -2;
    }
    lVar3 = ParseElementHeader(pReader,&pos,stop,&id,&size);
    lVar2 = size;
    lVar1 = pos;
    if (lVar3 < 0) break;
    if (size != 0) {
      if ((id == 0x7373) && (lVar3 = ParseTag(this,pos,size), lVar3 < 0)) {
        return lVar3;
      }
      pos = lVar1 + lVar2;
      if (stop < pos) {
        return -2;
      }
    }
  }
  return lVar3;
}

Assistant:

long Tags::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;  // payload start
  const long long stop = pos + m_size;  // payload stop

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)
      return status;

    if (size == 0)  // 0 length tag, read another
      continue;

    if (id == libwebm::kMkvTag) {
      status = ParseTag(pos, size);

      if (status < 0)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}